

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O0

void __thiscall amrex::AmrMesh::AmrMesh(AmrMesh *this,Geometry *level_0_geom,AmrInfo *amr_info)

{
  bool bVar1;
  int iVar2;
  vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *this_00;
  vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *this_01;
  size_type __new_size;
  value_type *__x;
  undefined8 *in_RDI;
  int lev;
  AmrInfo def_amr_info;
  int nlev;
  AmrMesh *in_stack_00000ae0;
  value_type *__x_00;
  Geometry *in_stack_fffffffffffffdf0;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *in_stack_fffffffffffffe00;
  Geometry *crse;
  value_type *in_stack_fffffffffffffe10;
  AmrInfo *in_stack_fffffffffffffe18;
  undefined8 *__new_size_00;
  AmrInfo *in_stack_fffffffffffffe20;
  AmrInfo *in_stack_fffffffffffffee0;
  int local_c0;
  
  AmrInfo::AmrInfo(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  *in_RDI = &PTR__AmrMesh_01aa49b8;
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::Vector
            ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)0x13720c3);
  Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::Vector
            ((Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
             0x13720dc);
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::Vector
            ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)0x13720f8);
  *(undefined4 *)(in_RDI + 0x1c) = 0;
  *(undefined4 *)((long)in_RDI + 0xe4) = 0;
  iVar2 = *(int *)((long)in_RDI + 0xc) + 1;
  AmrInfo::AmrInfo(in_stack_fffffffffffffee0);
  bVar1 = std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::empty
                    (in_stack_fffffffffffffe00);
  if (bVar1) {
    std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::back
              ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)in_stack_fffffffffffffdf0)
    ;
  }
  else {
    std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::back
              ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)in_stack_fffffffffffffdf0)
    ;
  }
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
            ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)in_stack_fffffffffffffe20,
             (size_type)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  bVar1 = std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::empty
                    (in_stack_fffffffffffffe00);
  if (bVar1) {
    std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::back
              ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)in_stack_fffffffffffffdf0)
    ;
  }
  else {
    std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::back
              ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)in_stack_fffffffffffffdf0)
    ;
  }
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
            ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)in_stack_fffffffffffffe20,
             (size_type)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  __new_size_00 = in_RDI + 8;
  this_00 = (vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)(long)iVar2;
  bVar1 = std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::empty
                    (in_stack_fffffffffffffe00);
  if (bVar1) {
    this_01 = (vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
              std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::back
                        ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                         in_stack_fffffffffffffdf0);
  }
  else {
    this_01 = (vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
              std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::back
                        ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                         in_stack_fffffffffffffdf0);
  }
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
            ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)this_00,
             (size_type)__new_size_00,(value_type *)this_01);
  crse = (Geometry *)(in_RDI + 0xb);
  __new_size = (size_type)iVar2;
  bVar1 = std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::empty
                    ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)crse);
  if (bVar1) {
    __x = (value_type *)
          std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::back
                    ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                     in_stack_fffffffffffffdf0);
  }
  else {
    __x = (value_type *)
          std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::back
                    ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                     in_stack_fffffffffffffdf0);
  }
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
            ((vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)this_00,
             (size_type)__new_size_00,(value_type *)this_01);
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::resize
            ((vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *)
             this_01,__new_size);
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::resize(this_01,__new_size);
  std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::reserve
            (this_00,(size_type)__new_size_00);
  std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::push_back
            ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)crse,__x);
  for (local_c0 = 1; local_c0 <= *(int *)((long)in_RDI + 0xc); local_c0 = local_c0 + 1) {
    __x_00 = (value_type *)(in_RDI + 0x13);
    in_stack_fffffffffffffdf0 =
         Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                   ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                    in_stack_fffffffffffffdf0,(size_type)__x_00);
    Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
              ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)in_stack_fffffffffffffdf0,
               (size_type)__x_00);
    refine(crse,(IntVect *)__x);
    std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::push_back
              ((vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               in_stack_fffffffffffffdf0,__x_00);
  }
  *(undefined4 *)((long)in_RDI + 0x94) = 0xffffffff;
  if ((*(byte *)(in_RDI + 0x12) & 1) != 0) {
    checkInput(in_stack_00000ae0);
  }
  AmrInfo::~AmrInfo((AmrInfo *)in_stack_fffffffffffffdf0);
  return;
}

Assistant:

AmrMesh::AmrMesh (Geometry const& level_0_geom, AmrInfo const& amr_info)
    : AmrInfo(amr_info)
{
    int nlev = max_level + 1;
    AmrInfo def_amr_info;
    ref_ratio.resize      (nlev, amr_info.ref_ratio.empty()
                           ? def_amr_info.ref_ratio.back()
                           :     amr_info.ref_ratio.back());
    blocking_factor.resize(nlev, amr_info.blocking_factor.empty()
                           ? def_amr_info.blocking_factor.back()
                           :     amr_info.blocking_factor.back());
    max_grid_size.resize  (nlev, amr_info.max_grid_size.empty()
                           ? def_amr_info.max_grid_size.back()
                           :     amr_info.max_grid_size.back());
    n_error_buf.resize    (nlev, amr_info.n_error_buf.empty()
                           ? def_amr_info.n_error_buf.back()
                           :     amr_info.n_error_buf.back());

    dmap.resize(nlev);
    grids.resize(nlev);
    geom.reserve(nlev);
    geom.push_back(level_0_geom);
    for (int lev = 1; lev <= max_level; ++lev) {
        geom.push_back(amrex::refine(geom[lev-1], ref_ratio[lev-1]));
    }

    finest_level = -1;

    if (check_input) checkInput();
}